

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_base.h
# Opt level: O3

void __thiscall bandit::reporter::progress_base::it_unknown_error(progress_base *this,string *desc)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  ostream *poVar4;
  _List_node_base *p_Var5;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  this->specs_failed_ = this->specs_failed_ + 1;
  std::__cxx11::stringstream::stringstream(local_1a8);
  cVar3 = (char)(ostream *)local_198;
  std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  current_context_name_abi_cxx11_(&local_1c8,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar2 = &local_1c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Unknown exception",0x11);
  std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  p_Var5 = (_List_node_base *)operator_new(0x30);
  p_Var5[1]._M_next = p_Var5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p == paVar2) {
    p_Var5[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,local_1c8.field_2._M_local_buf[0]);
    p_Var5[2]._M_prev = (_List_node_base *)local_1c8.field_2._8_8_;
  }
  else {
    p_Var5[1]._M_next = (_List_node_base *)local_1c8._M_dataplus._M_p;
    p_Var5[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,local_1c8.field_2._M_local_buf[0]);
  }
  p_Var5[1]._M_prev = (_List_node_base *)local_1c8._M_string_length;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->failures_).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        specs_failed_++;

        std::stringstream ss;
        ss << std::endl;
        ss << current_context_name() << " " << desc << ":" << std::endl;
        ss << "Unknown exception";
        ss << std::endl;

        failures_.push_back(ss.str());
      }